

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauCanon.c
# Opt level: O3

void Abc_TgCalcScc(Abc_TgMan_t *pMan,int *pOut,int fSort)

{
  char cVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  long lVar4;
  long lVar5;
  TiedGroup *pTVar6;
  uint uVar7;
  ulong uVar8;
  int sum_1;
  int iVar9;
  byte bVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  int sum;
  int iVar14;
  int v;
  ulong uVar15;
  int *piVar16;
  int i;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  long lVar24;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  int iVar25;
  int iVar27;
  int iVar28;
  undefined1 auVar26 [16];
  int iVar29;
  int kv [10];
  ulong *local_70;
  int local_64;
  ulong local_60;
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  undefined8 local_38;
  
  local_70 = pMan->pTruth;
  uVar7 = pMan->nVars;
  local_48 = (undefined1  [16])0x0;
  local_58 = (undefined1  [16])0x0;
  local_38 = 0;
  local_64 = fSort;
  memset(pOut,0,(long)(int)uVar7 * 4);
  uVar13 = (ulong)uVar7;
  if (6 < (long)(int)uVar7) {
    if (uVar7 - 6 != 0x1f) {
      uVar7 = 1 << ((byte)(uVar7 - 6) & 0x1f);
      if ((int)uVar7 < 2) {
        uVar7 = 1;
      }
      local_60 = (ulong)uVar7;
      uVar11 = 0;
      do {
        uVar12 = local_70[uVar11];
        iVar9 = Abc_TtCountOnesInCofsFast6_rec::bit_count[uVar11 >> 8 & 0xffffff];
        iVar14 = Abc_TtCountOnesInCofsFast6_rec::bit_count[uVar11 & 0xff];
        lVar5 = 0;
        do {
          uVar8 = 0;
          iVar27 = 0;
          iVar25 = 0;
          do {
            if ((s_Truths6Neg[lVar5] >> (uVar8 & 0x3f) & 1) != 0) {
              if ((1L << ((byte)uVar8 & 0x3f) & uVar12) != 0) {
                iVar25 = iVar25 + (1 << ((char)Abc_TtCountOnesInCofsFast6_rec::bit_count[iVar27] +
                                         (char)iVar9 + (char)iVar14 & 0x1fU));
              }
              iVar27 = iVar27 + 1;
            }
            uVar8 = uVar8 + 1;
          } while (uVar8 != 0x40);
          pOut[lVar5] = pOut[lVar5] + iVar25;
          lVar5 = lVar5 + 1;
        } while (lVar5 != 6);
        uVar8 = 6;
        do {
          if (((uint)uVar11 >> ((int)uVar8 - 6U & 0x1f) & 1) == 0) {
            uVar7 = *(uint *)((long)&local_70 + uVar8 * 4);
            if (uVar12 == 0) {
              iVar9 = 0;
            }
            else {
              uVar15 = 0;
              piVar16 = Abc_TtCountOnesInCofsFast6_rec::bit_count;
              iVar9 = 0;
              do {
                if ((uVar12 >> (uVar15 & 0x3f) & 1) != 0) {
                  iVar9 = iVar9 + (1 << ((char)*piVar16 +
                                         (char)Abc_TtCountOnesInCofsFast6_rec::bit_count
                                               [(int)uVar7 >> 8] +
                                         (char)Abc_TtCountOnesInCofsFast6_rec::bit_count
                                               [uVar7 & 0xff] & 0x1fU));
                }
                uVar15 = uVar15 + 1;
                piVar16 = piVar16 + 1;
              } while (uVar15 != 0x40);
            }
            pOut[uVar8] = pOut[uVar8] + iVar9;
            *(uint *)((long)&local_70 + uVar8 * 4) = uVar7 + 1;
          }
          uVar8 = uVar8 + 1;
        } while (uVar8 != uVar13);
        uVar11 = uVar11 + 1;
      } while (uVar11 != local_60);
    }
    goto LAB_00505ccb;
  }
  if (uVar7 == 6) {
    uVar11 = *local_70;
  }
  else {
    lVar5 = 1L << ((byte)uVar7 & 0x3f);
    uVar11 = ~(-1L << ((byte)lVar5 & 0x3f)) & *local_70;
    *local_70 = uVar11;
    if (5 < uVar7) goto LAB_00505ccb;
    uVar12 = 0x40;
    if (0x40 < (ulong)(lVar5 * 2)) {
      uVar12 = lVar5 * 2;
    }
    uVar8 = (uVar12 - ((ulong)(uVar7 != 5) + lVar5 * 2) >> ((byte)uVar7 & 0x3f)) +
            (ulong)(uVar7 != 5);
    auVar26._8_4_ = (int)lVar5;
    auVar26._0_8_ = lVar5;
    auVar26._12_4_ = (int)((ulong)lVar5 >> 0x20);
    lVar4 = auVar26._8_8_ * 2;
    auVar22._8_4_ = (int)lVar4;
    auVar22._0_8_ = lVar5;
    auVar22._12_4_ = (int)((ulong)lVar4 >> 0x20);
    auVar17._8_8_ = 0;
    auVar17._0_8_ = uVar11;
    auVar19._8_4_ = (int)uVar8;
    auVar19._0_8_ = uVar8;
    auVar19._12_4_ = (int)(uVar8 >> 0x20);
    uVar12 = 0xfffffffffffffffe;
    do {
      auVar26 = auVar17;
      lVar24 = auVar22._8_8_;
      auVar2._8_4_ = (int)uVar11;
      auVar2._0_8_ = uVar11;
      auVar2._12_4_ = (int)(uVar11 >> 0x20);
      auVar18._8_8_ = auVar2._8_8_ << lVar24;
      auVar18._0_8_ = uVar11 << auVar22._0_8_;
      auVar17 = auVar18 | auVar26;
      auVar22._0_8_ = auVar22._0_8_ + lVar5 * 2;
      auVar22._8_8_ = lVar24 + lVar4;
      uVar12 = uVar12 + 2;
    } while ((uVar8 & 0xfffffffffffffffe) != uVar12);
    auVar21._8_4_ = (int)uVar12;
    auVar21._0_8_ = uVar12;
    auVar21._12_4_ = (int)(uVar12 >> 0x20);
    auVar19 = auVar19 ^ _DAT_0093d220;
    auVar22 = (auVar21 | _DAT_0093d210) ^ _DAT_0093d220;
    iVar25 = -(uint)(auVar19._0_4_ < auVar22._0_4_);
    iVar27 = -(uint)(auVar19._4_4_ < auVar22._4_4_);
    iVar28 = -(uint)(auVar19._8_4_ < auVar22._8_4_);
    iVar29 = -(uint)(auVar19._12_4_ < auVar22._12_4_);
    iVar9 = -(uint)(auVar22._4_4_ == auVar19._4_4_);
    iVar14 = -(uint)(auVar22._12_4_ == auVar19._12_4_);
    auVar20._4_4_ = iVar9;
    auVar20._0_4_ = iVar9;
    auVar20._8_4_ = iVar14;
    auVar20._12_4_ = iVar14;
    auVar3._4_4_ = iVar25;
    auVar3._0_4_ = iVar25;
    auVar3._8_4_ = iVar28;
    auVar3._12_4_ = iVar28;
    auVar23._4_4_ = iVar27;
    auVar23._0_4_ = iVar27;
    auVar23._8_4_ = iVar29;
    auVar23._12_4_ = iVar29;
    auVar23 = auVar23 | auVar20 & auVar3;
    auVar17 = ~auVar23 & auVar17 | auVar26 & auVar23;
    uVar11 = auVar17._8_8_ | auVar17._0_8_;
    *local_70 = uVar11;
    if (uVar13 == 0) goto LAB_00505ccb;
  }
  uVar12 = 0;
  do {
    uVar8 = 0;
    iVar9 = 0;
    iVar14 = 0;
    do {
      if ((s_Truths6Neg[uVar12] >> (uVar8 & 0x3f) & 1) != 0) {
        if ((1L << ((byte)uVar8 & 0x3f) & uVar11) != 0) {
          iVar14 = iVar14 + (1 << (*(byte *)(Abc_TtCountOnesInCofsFast6_rec::bit_count + iVar9) &
                                  0x1f));
        }
        iVar9 = iVar9 + 1;
      }
      uVar8 = uVar8 + 1;
    } while (uVar8 != 0x40);
    pOut[uVar12] = pOut[uVar12] + iVar14;
    uVar12 = uVar12 + 1;
  } while (uVar12 != uVar13);
LAB_00505ccb:
  if (0 < pMan->nGVars) {
    lVar5 = 0;
    iVar9 = 0;
    do {
      iVar14 = pOut[iVar9];
      pOut[lVar5] = iVar14;
      bVar10 = pMan->pPerm[lVar5];
      if (-1 < (char)bVar10) {
        piVar16 = pOut + (long)iVar9 + 1;
        while( true ) {
          iVar9 = iVar9 + 1;
          bVar10 = pMan->symLink[bVar10];
          if ((char)bVar10 < '\0') break;
          iVar25 = *piVar16;
          piVar16 = piVar16 + 1;
          if (iVar14 != iVar25) {
            __assert_fail("pMan->symLink[k] < 0 || pOut[j] == pOut[i]",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/dau/dauCanon.c"
                          ,0x8fc,"void Abc_TgCalcScc(Abc_TgMan_t *, int *, int)");
          }
        }
      }
      lVar5 = lVar5 + 1;
    } while (lVar5 < pMan->nGVars);
  }
  if ((local_64 != 0) && (iVar9 = pMan->nGroups, 0 < iVar9)) {
    pTVar6 = pMan->pGroup;
    do {
      cVar1 = pTVar6->nGVars;
      if (1 < cVar1) {
        uVar7 = (uint)pTVar6->iStart;
        lVar5 = (long)(int)uVar7;
        uVar13 = lVar5 + 1;
        do {
          iVar9 = pOut[uVar13];
          uVar12 = uVar13 & 0xffffffff;
          uVar11 = uVar13;
          if (lVar5 < (long)uVar13) {
            do {
              uVar12 = uVar11;
              if (pOut[uVar12 - 1] <= iVar9) goto LAB_00505d7f;
              pOut[uVar12] = pOut[uVar12 - 1];
              uVar11 = uVar12 - 1;
            } while (lVar5 < (long)(uVar12 - 1));
            uVar12 = (ulong)uVar7;
          }
LAB_00505d7f:
          pOut[(int)uVar12] = iVar9;
          uVar13 = uVar13 + 1;
        } while ((long)uVar13 < (long)(int)((int)cVar1 + uVar7));
        iVar9 = pMan->nGroups;
      }
      pTVar6 = pTVar6 + 1;
    } while (pTVar6 < pMan->pGroup + iVar9);
  }
  return;
}

Assistant:

static void Abc_TgCalcScc(Abc_TgMan_t * pMan, int * pOut, int fSort)
{
    int i, j, k;
    TiedGroup * pGrp;

    Abc_TtSccInCofs(pMan->pTruth, pMan->nVars, pOut);

    for (i = j = 0; j < pMan->nGVars; j++)
    {
        pOut[j] = pOut[i];
        for (k = pMan->pPerm[j]; k >= 0; k = pMan->symLink[k])
        {
            i++;
            assert(pMan->symLink[k] < 0 || pOut[j] == pOut[i]);
        }
    }
    if (!fSort) return;

    for (pGrp = pMan->pGroup; pGrp < pMan->pGroup + pMan->nGroups; pGrp++)
    {
        int vb = pGrp->iStart, ve = vb + pGrp->nGVars;
        for (i = vb + 1; i < ve; i++)
        {
            int a = pOut[i];
            for (j = i; j > vb && pOut[j - 1] > a; j--)
                pOut[j] = pOut[j - 1];
            pOut[j] = a;
        }
    }
}